

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,QChar *c)

{
  QTextStreamPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((pQVar1->string == (QString *)0x0) && (pQVar1->device == (QIODevice *)0x0)) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning(&local_40,"QTextStream: No device");
  }
  else {
    QTextStreamPrivate::scan(pQVar1,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
    bVar2 = QTextStreamPrivate::getChar(pQVar1,c);
    if ((!bVar2) &&
       (pQVar1 = (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                 .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl,
       pQVar1->status == Ok)) {
      pQVar1->status = ReadPastEnd;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(QChar &c)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    if (!d->getChar(&c))
        setStatus(ReadPastEnd);
    return *this;
}